

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> * __thiscall
kratos::FSM::get_all_child_fsm
          (vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *__return_storage_ptr__,FSM *this)

{
  __node_base_ptr *this_00;
  iterator iVar1;
  _Base_ptr p_Var2;
  UserException *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view format_str;
  format_args args;
  undefined1 local_110 [8];
  unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
  visited;
  queue<kratos::FSM_*,_std::deque<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>_> queue;
  undefined1 local_78 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
  children;
  FSM *local_40;
  FSM *fsm;
  
  (__return_storage_ptr__->super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fsm = (FSM *)__return_storage_ptr__;
  std::queue<kratos::FSM*,std::deque<kratos::FSM*,std::allocator<kratos::FSM*>>>::
  queue<std::deque<kratos::FSM*,std::allocator<kratos::FSM*>>,void>
            ((queue<kratos::FSM_*,_std::deque<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>_> *)
             &visited._M_h._M_single_bucket);
  local_110 = (undefined1  [8])&visited._M_h._M_rehash_policy._M_next_resize;
  visited._M_h._M_buckets = (__buckets_ptr)0x1;
  visited._M_h._M_bucket_count = 0;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count._0_4_ = 0x3f800000;
  visited._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visited._M_h._M_rehash_policy._4_4_ = 0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  local_78 = (undefined1  [8])this;
  children._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::deque<kratos::FSM*,std::allocator<kratos::FSM*>>::emplace_back<kratos::FSM*>
            ((deque<kratos::FSM*,std::allocator<kratos::FSM*>> *)&visited._M_h._M_single_bucket,
             (FSM **)local_78);
  this_00 = &visited._M_h._M_single_bucket;
  while( true ) {
    if (queue.c.super__Deque_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_node ==
        (_Map_pointer)
        queue.c.super__Deque_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
        super__Deque_impl_data._M_map_size) {
      std::
      _Hashtable<const_kratos::FSM_*,_const_kratos::FSM_*,_std::allocator<const_kratos::FSM_*>,_std::__detail::_Identity,_std::equal_to<const_kratos::FSM_*>,_std::hash<const_kratos::FSM_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<const_kratos::FSM_*,_const_kratos::FSM_*,_std::allocator<const_kratos::FSM_*>,_std::__detail::_Identity,_std::equal_to<const_kratos::FSM_*>,_std::hash<const_kratos::FSM_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_110);
      std::_Deque_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>::~_Deque_base
                ((_Deque_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *)
                 &visited._M_h._M_single_bucket);
      return (vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *)fsm;
    }
    local_40 = *(FSM **)queue.c.super__Deque_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                        _M_impl.super__Deque_impl_data._M_map_size;
    std::deque<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>::pop_front
              ((deque<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *)this_00);
    std::vector<kratos::FSM*,std::allocator<kratos::FSM*>>::emplace_back<kratos::FSM*&>
              ((vector<kratos::FSM*,std::allocator<kratos::FSM*>> *)fsm,&local_40);
    iVar1 = std::
            _Hashtable<const_kratos::FSM_*,_const_kratos::FSM_*,_std::allocator<const_kratos::FSM_*>,_std::__detail::_Identity,_std::equal_to<const_kratos::FSM_*>,_std::hash<const_kratos::FSM_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find((_Hashtable<const_kratos::FSM_*,_const_kratos::FSM_*,_std::allocator<const_kratos::FSM_*>,_std::__detail::_Identity,_std::equal_to<const_kratos::FSM_*>,_std::hash<const_kratos::FSM_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)local_110,&local_40);
    if (iVar1.super__Node_iterator_base<const_kratos::FSM_*,_false>._M_cur != (__node_type *)0x0)
    break;
    std::
    _Hashtable<kratos::FSM_const*,kratos::FSM_const*,std::allocator<kratos::FSM_const*>,std::__detail::_Identity,std::equal_to<kratos::FSM_const*>,std::hash<kratos::FSM_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<kratos::FSM*&>
              ((_Hashtable<kratos::FSM_const*,kratos::FSM_const*,std::allocator<kratos::FSM_const*>,std::__detail::_Identity,std::equal_to<kratos::FSM_const*>,std::hash<kratos::FSM_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_110,&local_40);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
                *)local_78,&(local_40->child_fsms_)._M_t);
    for (p_Var2 = children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var2 != (_Rb_tree_node_base *)&children;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      std::deque<kratos::FSM*,std::allocator<kratos::FSM*>>::emplace_back<kratos::FSM*const&>
                ((deque<kratos::FSM*,std::allocator<kratos::FSM*>> *)this_00,(FSM **)(p_Var2 + 2));
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
                 *)local_78);
  }
  this_01 = (UserException *)__cxa_allocate_exception(0x10);
  queue.c.super__Deque_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node =
       *(_Map_pointer *)children._M_t._M_impl.super__Rb_tree_header._M_node_count;
  bVar3 = fmt::v7::to_string_view<char,_0>("FSM {0} has circular dependency");
  format_str.data_ = (char *)bVar3.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)
           &queue.c.super__Deque_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  fmt::v7::detail::vformat_abi_cxx11_((string *)local_78,(detail *)bVar3.data_,format_str,args);
  UserException::UserException(this_01,(string *)local_78);
  __cxa_throw(this_01,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<FSM*> FSM::get_all_child_fsm() const {
    std::vector<FSM*> result;
    std::queue<FSM*> queue;
    std::unordered_set<const FSM*> visited;
    queue.emplace(const_cast<FSM*>(this));
    while (!queue.empty()) {
        auto* fsm = queue.front();
        queue.pop();
        result.emplace_back(fsm);
        if (visited.find(fsm) != visited.end())
            throw UserException(::format("FSM {0} has circular dependency", fsm_name_));

        visited.emplace(fsm);
        auto children = fsm->child_fsms_;
        for (auto const& iter : children) queue.emplace(iter.second);
    }
    return result;
}